

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_small_width_height_test.cc
# Opt level: O1

void anon_unknown.dwarf_160f534::EncodeSmallHeightMultiThreaded
               (aom_img_fmt fmt,aom_codec_flags_t flag)

{
  undefined8 *puVar1;
  aom_codec_iface_t *iface;
  pointer *__ptr;
  SEARCH_METHODS *pSVar2;
  AssertionResult gtest_ar_2;
  aom_codec_ctx_t enc;
  aom_image_t img;
  aom_codec_enc_cfg_t cfg;
  AssertHelper local_4a8;
  AssertHelper local_4a0;
  AssertHelper local_498;
  undefined8 *local_490;
  aom_codec_ctx_t local_488;
  aom_image_t local_450;
  aom_codec_enc_cfg_t local_3a8;
  
  local_488.name = (char *)&local_450;
  local_498.data_ =
       (AssertHelperData *)
       aom_img_wrap((aom_image_t *)local_488.name,fmt,0x200,0x40,1,(anonymous_namespace)::kBuffer);
  testing::internal::CmpHelperEQ<aom_image*,aom_image*>
            ((internal *)&local_3a8,"&img",
             "aom_img_wrap(&img, fmt, kWidth, kHeight, 1, const_cast<unsigned char *>(kBuffer))",
             (aom_image **)&local_488,(aom_image **)&local_498);
  if ((char)local_3a8.g_usage == '\0') {
    testing::Message::Message((Message *)&local_488);
    if ((undefined8 *)CONCAT44(local_3a8.g_w,local_3a8.g_profile) == (undefined8 *)0x0) {
      pSVar2 = "";
    }
    else {
      pSVar2 = *(SEARCH_METHODS **)CONCAT44(local_3a8.g_w,local_3a8.g_profile);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_498,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/encode_small_width_height_test.cc"
               ,0x74,(char *)pSVar2);
    testing::internal::AssertHelper::operator=(&local_498,(Message *)&local_488);
    testing::internal::AssertHelper::~AssertHelper(&local_498);
    if ((aom_image_t *)local_488.name != (aom_image_t *)0x0) {
      (**(code **)(*(long *)local_488.name + 8))();
    }
  }
  puVar1 = (undefined8 *)CONCAT44(local_3a8.g_w,local_3a8.g_profile);
  if (puVar1 != (undefined8 *)0x0) {
    if ((undefined8 *)*puVar1 != puVar1 + 2) {
      operator_delete((undefined8 *)*puVar1);
    }
    operator_delete(puVar1);
  }
  iface = aom_codec_av1_cx();
  local_498.data_ = local_498.data_ & 0xffffffff00000000;
  local_4a8.data_._0_4_ = aom_codec_enc_config_default(iface,&local_3a8,0);
  testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
            ((internal *)&local_488,"AOM_CODEC_OK",
             "aom_codec_enc_config_default(iface, &cfg, kUsage)",(aom_codec_err_t *)&local_498,
             (aom_codec_err_t *)&local_4a8);
  if ((char)local_488.name == '\0') {
    testing::Message::Message((Message *)&local_498);
    if (local_488.iface == (aom_codec_iface_t *)0x0) {
      pSVar2 = "";
    }
    else {
      pSVar2 = (SEARCH_METHODS *)(local_488.iface)->name;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_4a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/encode_small_width_height_test.cc"
               ,0x78,(char *)pSVar2);
    testing::internal::AssertHelper::operator=(&local_4a8,(Message *)&local_498);
    testing::internal::AssertHelper::~AssertHelper(&local_4a8);
    if (local_498.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_498.data_ + 8))();
    }
  }
  if (local_488.iface != (aom_codec_iface_t *)0x0) {
    if ((aom_codec_caps_t *)(local_488.iface)->name != &(local_488.iface)->caps) {
      operator_delete((local_488.iface)->name);
    }
    operator_delete(local_488.iface);
  }
  local_3a8.g_threads = 2;
  local_3a8.g_w = 0x200;
  local_3a8.g_h = 0x40;
  local_4a8.data_._0_4_ = 0;
  local_4a0.data_._0_4_ = aom_codec_enc_init_ver(&local_488,iface,&local_3a8,flag,0x1d);
  testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
            ((internal *)&local_498,"AOM_CODEC_OK",
             "aom_codec_enc_init_ver(&enc, iface, &cfg, flag, (10 + (7 + (9)) + 3))",
             (aom_codec_err_t *)&local_4a8,(aom_codec_err_t *)&local_4a0);
  if (local_498.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_4a8);
    if (local_490 == (undefined8 *)0x0) {
      pSVar2 = "";
    }
    else {
      pSVar2 = (SEARCH_METHODS *)*local_490;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_4a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/encode_small_width_height_test.cc"
               ,0x7d,(char *)pSVar2);
    testing::internal::AssertHelper::operator=(&local_4a0,(Message *)&local_4a8);
    testing::internal::AssertHelper::~AssertHelper(&local_4a0);
    if ((long *)CONCAT44(local_4a8.data_._4_4_,(aom_codec_err_t)local_4a8.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_4a8.data_._4_4_,(aom_codec_err_t)local_4a8.data_) + 8))()
      ;
    }
  }
  puVar1 = local_490;
  if (local_490 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_490 != local_490 + 2) {
      operator_delete((undefined8 *)*local_490);
    }
    operator_delete(puVar1);
  }
  local_4a8.data_._0_4_ = 0;
  local_4a0.data_._0_4_ = aom_codec_control(&local_488,0xd,5);
  testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
            ((internal *)&local_498,"AOM_CODEC_OK","aom_codec_control(&enc, AOME_SET_CPUUSED, 5)",
             (aom_codec_err_t *)&local_4a8,(aom_codec_err_t *)&local_4a0);
  if (local_498.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_4a8);
    if (local_490 == (undefined8 *)0x0) {
      pSVar2 = "";
    }
    else {
      pSVar2 = (SEARCH_METHODS *)*local_490;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_4a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/encode_small_width_height_test.cc"
               ,0x7e,(char *)pSVar2);
    testing::internal::AssertHelper::operator=(&local_4a0,(Message *)&local_4a8);
    testing::internal::AssertHelper::~AssertHelper(&local_4a0);
    if ((long *)CONCAT44(local_4a8.data_._4_4_,(aom_codec_err_t)local_4a8.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_4a8.data_._4_4_,(aom_codec_err_t)local_4a8.data_) + 8))()
      ;
    }
  }
  puVar1 = local_490;
  if (local_490 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_490 != local_490 + 2) {
      operator_delete((undefined8 *)*local_490);
    }
    operator_delete(puVar1);
  }
  local_4a8.data_._0_4_ = 0;
  local_4a0.data_._0_4_ = aom_codec_encode(&local_488,&local_450,0,1,0);
  testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
            ((internal *)&local_498,"AOM_CODEC_OK","aom_codec_encode(&enc, &img, 0, 1, 0)",
             (aom_codec_err_t *)&local_4a8,(aom_codec_err_t *)&local_4a0);
  if (local_498.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_4a8);
    if (local_490 == (undefined8 *)0x0) {
      pSVar2 = "";
    }
    else {
      pSVar2 = (SEARCH_METHODS *)*local_490;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_4a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/encode_small_width_height_test.cc"
               ,0x7f,(char *)pSVar2);
    testing::internal::AssertHelper::operator=(&local_4a0,(Message *)&local_4a8);
    testing::internal::AssertHelper::~AssertHelper(&local_4a0);
    if ((long *)CONCAT44(local_4a8.data_._4_4_,(aom_codec_err_t)local_4a8.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_4a8.data_._4_4_,(aom_codec_err_t)local_4a8.data_) + 8))()
      ;
    }
  }
  puVar1 = local_490;
  if (local_490 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_490 != local_490 + 2) {
      operator_delete((undefined8 *)*local_490);
    }
    operator_delete(puVar1);
  }
  local_4a8.data_._0_4_ = 0;
  local_4a0.data_._0_4_ = aom_codec_encode(&local_488,(aom_image_t *)0x0,0,0,0);
  testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
            ((internal *)&local_498,"AOM_CODEC_OK","aom_codec_encode(&enc, nullptr, 0, 0, 0)",
             (aom_codec_err_t *)&local_4a8,(aom_codec_err_t *)&local_4a0);
  if (local_498.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_4a8);
    if (local_490 == (undefined8 *)0x0) {
      pSVar2 = "";
    }
    else {
      pSVar2 = (SEARCH_METHODS *)*local_490;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_4a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/encode_small_width_height_test.cc"
               ,0x80,(char *)pSVar2);
    testing::internal::AssertHelper::operator=(&local_4a0,(Message *)&local_4a8);
    testing::internal::AssertHelper::~AssertHelper(&local_4a0);
    if ((long *)CONCAT44(local_4a8.data_._4_4_,(aom_codec_err_t)local_4a8.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_4a8.data_._4_4_,(aom_codec_err_t)local_4a8.data_) + 8))()
      ;
    }
  }
  puVar1 = local_490;
  if (local_490 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_490 != local_490 + 2) {
      operator_delete((undefined8 *)*local_490);
    }
    operator_delete(puVar1);
  }
  local_4a8.data_._0_4_ = 0;
  local_4a0.data_._0_4_ = aom_codec_destroy(&local_488);
  testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
            ((internal *)&local_498,"AOM_CODEC_OK","aom_codec_destroy(&enc)",
             (aom_codec_err_t *)&local_4a8,(aom_codec_err_t *)&local_4a0);
  if (local_498.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_4a8);
    if (local_490 == (undefined8 *)0x0) {
      pSVar2 = "";
    }
    else {
      pSVar2 = (SEARCH_METHODS *)*local_490;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_4a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/encode_small_width_height_test.cc"
               ,0x81,(char *)pSVar2);
    testing::internal::AssertHelper::operator=(&local_4a0,(Message *)&local_4a8);
    testing::internal::AssertHelper::~AssertHelper(&local_4a0);
    if ((long *)CONCAT44(local_4a8.data_._4_4_,(aom_codec_err_t)local_4a8.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_4a8.data_._4_4_,(aom_codec_err_t)local_4a8.data_) + 8))()
      ;
    }
  }
  if (local_490 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_490 != local_490 + 2) {
      operator_delete((undefined8 *)*local_490);
    }
    operator_delete(local_490);
  }
  return;
}

Assistant:

void EncodeSmallHeightMultiThreaded(aom_img_fmt fmt, aom_codec_flags_t flag) {
  // The image has only one tile and the tile is one AV1 superblock tall.
  // For speed >= 1, superblock size is 64x64 (see av1_select_sb_size()).
  constexpr int kWidth = 512;
  constexpr int kHeight = 64;

  aom_image_t img;
  EXPECT_EQ(&img, aom_img_wrap(&img, fmt, kWidth, kHeight, 1,
                               const_cast<unsigned char *>(kBuffer)));

  aom_codec_iface_t *iface = aom_codec_av1_cx();
  aom_codec_enc_cfg_t cfg;
  EXPECT_EQ(AOM_CODEC_OK, aom_codec_enc_config_default(iface, &cfg, kUsage));
  cfg.g_threads = 2;
  cfg.g_w = kWidth;
  cfg.g_h = kHeight;
  aom_codec_ctx_t enc;
  EXPECT_EQ(AOM_CODEC_OK, aom_codec_enc_init(&enc, iface, &cfg, flag));
  EXPECT_EQ(AOM_CODEC_OK, aom_codec_control(&enc, AOME_SET_CPUUSED, 5));
  EXPECT_EQ(AOM_CODEC_OK, aom_codec_encode(&enc, &img, 0, 1, 0));
  EXPECT_EQ(AOM_CODEC_OK, aom_codec_encode(&enc, nullptr, 0, 0, 0));
  EXPECT_EQ(AOM_CODEC_OK, aom_codec_destroy(&enc));
}